

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall shift_window_transformer::Tensor<float>::~Tensor(Tensor<float> *this)

{
  Tensor<float> *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->shape);
  std::vector<float,_std::allocator<float>_>::~vector
            (&this->super_vector<float,_std::allocator<float>_>);
  return;
}

Assistant:

Tensor() : std::vector<T>() {
        }